

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O2

void __thiscall FSoundSequencePtrArray::~FSoundSequencePtrArray(FSoundSequencePtrArray *this)

{
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (this->super_TArray<FSoundSequence_*,_FSoundSequence_*>).Count;
      uVar1 = uVar1 + 1) {
    M_Free((this->super_TArray<FSoundSequence_*,_FSoundSequence_*>).Array[uVar1]);
  }
  TArray<FSoundSequence_*,_FSoundSequence_*>::~TArray
            (&this->super_TArray<FSoundSequence_*,_FSoundSequence_*>);
  return;
}

Assistant:

~FSoundSequencePtrArray()
	{
		for (unsigned int i = 0; i < Size(); ++i)
		{
			M_Free((*this)[i]);
		}
	}